

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::TypeParameterDeclarationSyntax::TypeParameterDeclarationSyntax
          (TypeParameterDeclarationSyntax *this,Token keyword,Token typeKeyword,
          ForwardTypeRestrictionSyntax *typeRestriction,
          SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax> *declarators)

{
  size_t sVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  TypeAssignmentSyntax *pTVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax> *__range2;
  iterator_base<slang::syntax::TypeAssignmentSyntax_*> local_30;
  
  uVar5 = typeKeyword._0_8_;
  uVar6 = keyword._0_8_;
  (this->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.kind = TypeParameterDeclaration;
  (this->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (this->super_ParameterDeclarationBaseSyntax).keyword.kind = (short)uVar6;
  (this->super_ParameterDeclarationBaseSyntax).keyword.field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->super_ParameterDeclarationBaseSyntax).keyword.numFlags =
       (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->super_ParameterDeclarationBaseSyntax).keyword.rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->super_ParameterDeclarationBaseSyntax).keyword.info = keyword.info;
  (this->typeKeyword).kind = (short)uVar5;
  (this->typeKeyword).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->typeKeyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->typeKeyword).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->typeKeyword).info = typeKeyword.info;
  this->typeRestriction = typeRestriction;
  uVar3 = *(undefined4 *)&(declarators->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (declarators->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.kind =
       (declarators->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->declarators).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (declarators->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->declarators).super_SyntaxListBase.childCount =
       (declarators->super_SyntaxListBase).childCount;
  (this->declarators).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_0057f318;
  sVar1 = (declarators->elements)._M_extent._M_extent_value;
  (this->declarators).elements._M_ptr = (declarators->elements)._M_ptr;
  (this->declarators).elements._M_extent._M_extent_value = sVar1;
  if (typeRestriction != (ForwardTypeRestrictionSyntax *)0x0) {
    (typeRestriction->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  local_30.index = 0;
  sVar1 = (this->declarators).elements._M_extent._M_extent_value;
  local_30.list = &this->declarators;
  for (; (local_30.list != &this->declarators || (local_30.index != sVar1 + 1 >> 1));
      local_30.index = local_30.index + 1) {
    pTVar4 = SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::
             iterator_base<slang::syntax::TypeAssignmentSyntax_*>::dereference(&local_30);
    (pTVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

TypeParameterDeclarationSyntax(Token keyword, Token typeKeyword, ForwardTypeRestrictionSyntax* typeRestriction, const SeparatedSyntaxList<TypeAssignmentSyntax>& declarators) :
        ParameterDeclarationBaseSyntax(SyntaxKind::TypeParameterDeclaration, keyword), typeKeyword(typeKeyword), typeRestriction(typeRestriction), declarators(declarators) {
        if (this->typeRestriction) this->typeRestriction->parent = this;
        this->declarators.parent = this;
        for (auto child : this->declarators)
            child->parent = this;
    }